

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

int dmrC_test_parse(void)

{
  dmr_C *C;
  size_t size;
  token *ptVar1;
  char *pcVar2;
  long lVar3;
  symbol_list **list;
  uchar *puVar4;
  uchar *puVar5;
  token *p;
  token *ptVar6;
  byte bVar7;
  uchar local_98 [8];
  char test1 [100];
  token *end;
  
  bVar7 = 0;
  C = new_dmr_C();
  puVar4 = (uchar *)
           "extern int printf(const char *, ...); int main() { printf(\"hello world!\\n\"); return 0; }"
  ;
  puVar5 = local_98;
  for (lVar3 = 100; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
  }
  size = strlen((char *)local_98);
  ptVar1 = dmrC_tokenize_buffer(C,local_98,size,(token **)(test1 + 0x60));
  for (ptVar6 = ptVar1; ptVar6 != &dmrC_eof_token_entry_; ptVar6 = ptVar6->next) {
    pcVar2 = dmrC_show_token(C,ptVar6);
    puts(pcVar2);
  }
  putchar(10);
  ptVar1 = dmrC_preprocess(C,ptVar1);
  for (ptVar6 = ptVar1; ptVar6 != &dmrC_eof_token_entry_; ptVar6 = ptVar6->next) {
    pcVar2 = dmrC_show_token(C,ptVar6);
    puts(pcVar2);
  }
  for (; list = &C->S->translation_unit_used_list, ptVar1 != &dmrC_eof_token_entry_;
      ptVar1 = dmrC_external_declaration(C,ptVar1,list,(validate_decl_t)0x0)) {
  }
  dmrC_show_symbol_list(C,*list,"\n\n");
  destroy_dmr_C(C);
  return 0;
}

Assistant:

int dmrC_test_parse() {
	struct dmr_C *C = new_dmr_C();
	char test1[100] = "extern int printf(const char *, ...); int main() { printf(\"hello world!\\n\"); return 0; }";
	struct token *start;
	struct token *end;
	start = dmrC_tokenize_buffer(C, (unsigned char *)test1,
		(unsigned long)strlen(test1), &end);
	for (struct token *p = start; !dmrC_eof_token(p); p = p->next) {
		printf("%s\n", dmrC_show_token(C, p));
	}
	printf("\n");
	start = dmrC_preprocess(C, start);
	for (struct token *p = start; !dmrC_eof_token(p); p = p->next) {
		printf("%s\n", dmrC_show_token(C, p));
	}
	while (!dmrC_eof_token(start))
		start = dmrC_external_declaration(C, start, &C->S->translation_unit_used_list, NULL);
	dmrC_show_symbol_list(C, C->S->translation_unit_used_list, "\n\n");
	destroy_dmr_C(C);
	return 0;
}